

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhLoadPage(lhash_kv_engine *pEngine,pgno pnum,lhpage *pMaster,lhpage **ppOut,int iNest)

{
  pgno *n64;
  uint uVar1;
  uint uVar2;
  ushort *puVar3;
  uchar *puVar4;
  pgno pnum_00;
  bool bVar5;
  sxu16 sVar6;
  int iVar7;
  lhpage *pPage;
  ulong uVar8;
  lhcell *pCell;
  uint *puVar9;
  lhcell *plVar10;
  lhpage *pMaster_00;
  uint *puVar11;
  ushort uVar12;
  ulong uVar13;
  unqlite_page *pRaw;
  unqlite_page *local_38;
  
  iVar7 = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,pnum,&local_38);
  if (iVar7 != 0) {
    return iVar7;
  }
  pPage = (lhpage *)local_38->pUserData;
  if (pPage == (lhpage *)0x0) {
    pPage = lhNewPage(pEngine,local_38,pMaster);
    if (pPage == (lhpage *)0x0) {
      return -1;
    }
    puVar3 = (ushort *)pPage->pRaw->zData;
    (pPage->sHdr).iOfft = *puVar3 << 8 | *puVar3 >> 8;
    (pPage->sHdr).iFree = puVar3[1] << 8 | puVar3[1] >> 8;
    n64 = &(pPage->sHdr).iSlave;
    SyBigEndianUnpack64((uchar *)(puVar3 + 2),n64);
    puVar4 = pPage->pRaw->zData;
    uVar8 = (ulong)(pPage->sHdr).iFree;
    sVar6 = 0;
    if (uVar8 == 0) {
LAB_00113ba6:
      pPage->nFree = sVar6;
      iVar7 = 0;
      bVar5 = true;
    }
    else {
      do {
        uVar12 = *(ushort *)(puVar4 + uVar8) << 8 | *(ushort *)(puVar4 + uVar8) >> 8;
        sVar6 = (*(ushort *)(puVar4 + uVar8 + 2) << 8 | *(ushort *)(puVar4 + uVar8 + 2) >> 8) +
                sVar6;
        if (uVar12 == 0) goto LAB_00113ba6;
        uVar8 = (ulong)uVar12;
      } while ((long)uVar8 < (long)pPage->pHash->iPageSize);
      iVar7 = -0x18;
      bVar5 = false;
    }
    if (bVar5) {
      uVar8 = (ulong)(pPage->sHdr).iOfft;
      if (uVar8 == 0) {
LAB_00113d0d:
        iVar7 = 0;
      }
      else {
        puVar11 = (uint *)(puVar4 + uVar8);
        puVar9 = (uint *)((long)pPage->pHash->iPageSize + (long)puVar11);
        plVar10 = (lhcell *)0x0;
        do {
          puVar4 = pPage->pRaw->zData;
          uVar1 = *puVar11;
          uVar2 = puVar11[1];
          uVar8 = *(ulong *)(puVar11 + 2);
          uVar12 = (ushort)puVar11[4] << 8 | (ushort)puVar11[4] >> 8;
          uVar13 = uVar8;
          if ((uVar12 == 0) || (iVar7 = -0x18, puVar4 + uVar12 < puVar9)) {
            pCell = lhNewCell(pPage->pHash,pPage);
            if (pCell == (lhcell *)0x0) {
              iVar7 = -1;
            }
            else {
              pCell->iNext = uVar12;
              pCell->nKey = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                            uVar2 << 0x18;
              pCell->nData = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                             (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                             (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                             (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
              pCell->nHash = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                             uVar1 << 0x18;
              SyBigEndianUnpack64((uchar *)((long)puVar11 + 0x12),&pCell->iOvfl);
              pCell->iStart = (short)puVar11 - (short)puVar4;
              iVar7 = lhConsumeCellkey(pCell,unqliteDataConsumer,&pCell->sKey,
                                       (uint)(0x40000 < pCell->nKey));
              if (iVar7 != 0) {
                SyBlobRelease(&pCell->sKey);
              }
              iVar7 = lhInstallCell(pCell);
              if (iVar7 == 0) {
                plVar10 = pCell;
              }
              iVar7 = -(uint)(iVar7 != 0);
            }
          }
          iNest = (int)uVar13;
          if (iVar7 != 0) goto LAB_00113d10;
          if ((ulong)plVar10->iNext == 0) goto LAB_00113d0d;
          puVar11 = (uint *)(pPage->pRaw->zData + plVar10->iNext);
        } while (puVar11 < puVar9);
        iVar7 = -0x18;
      }
    }
LAB_00113d10:
    if (iVar7 != 0) {
      (*pEngine->pIo->xPageUnref)(pPage->pRaw);
      return iVar7;
    }
    pnum_00 = *n64;
    if (pnum_00 != 0) {
      pMaster_00 = pPage;
      if (pMaster != (lhpage *)0x0) {
        pMaster_00 = pMaster;
      }
      lhLoadPage(pEngine,pnum_00,pMaster_00,(lhpage **)0x0,iNest);
    }
  }
  if (ppOut != (lhpage **)0x0) {
    *ppOut = pPage;
  }
  return 0;
}

Assistant:

static int lhLoadPage(lhash_kv_engine *pEngine,pgno pnum,lhpage *pMaster,lhpage **ppOut,int iNest)
{
	unqlite_page *pRaw;
	lhpage *pPage = 0; /* cc warning */
	int rc;
	/* Aquire the page from the pager first */
	rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,pnum,&pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	if( pRaw->pUserData ){
		/* The page is already parsed and loaded in memory. Point to it */
		pPage = (lhpage *)pRaw->pUserData;
	}else{
		/* Allocate a new page */
		pPage = lhNewPage(pEngine,pRaw,pMaster);
		if( pPage == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Process the page */
		rc = lhParsePageHeader(pPage);
		if( rc == UNQLITE_OK ){
			/* Load cells */
			rc = lhLoadCells(pPage);
		}
		if( rc != UNQLITE_OK ){
			pEngine->pIo->xPageUnref(pPage->pRaw); /* pPage will be released inside this call */
			return rc;
		}
		if( pPage->sHdr.iSlave > 0 && iNest < 128 ){
			if( pMaster == 0 ){
				pMaster = pPage;
			}
			/* Slave page. Not a fatal error if something goes wrong here */
			lhLoadPage(pEngine,pPage->sHdr.iSlave,pMaster,0,iNest++);
		}
	}
	if( ppOut ){
		*ppOut = pPage;
	}
	return UNQLITE_OK;
}